

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O3

void __thiscall
helics::apps::PhasorGenerator::setString
          (PhasorGenerator *this,string_view parameter,string_view val)

{
  size_t sVar1;
  char *pcVar2;
  double __z;
  double dVar3;
  complex<double> val_00;
  
  pcVar2 = val._M_str;
  sVar1 = val._M_len;
  helicsGetComplex(val);
  dVar3 = cabs(__z);
  if (dVar3 < 1000000000000.0) {
    val_00._M_value._8_8_ = pcVar2;
    val_00._M_value._0_8_ = sVar1;
    set(this,parameter,val_00);
    return;
  }
  SignalGenerator::setString(&this->super_SignalGenerator,(string_view)parameter,(string_view)val);
  return;
}

Assistant:

void PhasorGenerator::setString(std::string_view parameter, std::string_view val)
    {
        auto valc = helicsGetComplex(val);
        if (std::abs(valc) < 1e12) {
            set(parameter, valc);
        } else {
            SignalGenerator::setString(parameter, val);
        }
    }